

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Plus(Compiler *this,Frag a,bool nongreedy)

{
  PatchList l;
  uint32_t p;
  Inst *pIVar1;
  Frag FVar2;
  PatchList local_50;
  PatchList pl;
  uint32_t local_40;
  bool bStack_3c;
  int id;
  bool nongreedy_local;
  Compiler *this_local;
  Frag a_local;
  uint32_t local_10;
  undefined4 uStack_c;
  
  this_local._0_4_ = a.begin;
  this_local._4_4_ = a.end.head;
  a_local.begin = a.end.tail;
  a_local.end.head = a._12_4_;
  p = AllocInst(this,1);
  if ((int)p < 0) {
    FVar2 = NoMatch(this);
    pl = FVar2._0_8_;
    a_local._8_8_ = pl;
    local_40 = FVar2.end.tail;
    local_10 = local_40;
    bStack_3c = FVar2.nullable;
    uStack_c = CONCAT31(uStack_c._1_3_,bStack_3c);
  }
  else {
    if (nongreedy) {
      pIVar1 = PODArray<re2::Prog::Inst>::operator[](&this->inst_,p);
      Prog::Inst::InitAlt(pIVar1,0,(uint32_t)this_local);
      local_50 = PatchList::Mk(p << 1);
    }
    else {
      pIVar1 = PODArray<re2::Prog::Inst>::operator[](&this->inst_,p);
      Prog::Inst::InitAlt(pIVar1,(uint32_t)this_local,0);
      local_50 = PatchList::Mk(p << 1 | 1);
    }
    pIVar1 = PODArray<re2::Prog::Inst>::data(&this->inst_);
    l.tail = a_local.begin;
    l.head = this_local._4_4_;
    PatchList::Patch(pIVar1,l,p);
    Frag::Frag((Frag *)&a_local.end.tail,(uint32_t)this_local,local_50,
               (bool)((byte)a_local.end.head & 1));
  }
  FVar2.end.tail = local_10;
  FVar2._0_8_ = a_local._8_8_;
  FVar2._12_4_ = uStack_c;
  return FVar2;
}

Assistant:

Frag Compiler::Plus(Frag a, bool nongreedy) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  PatchList::Patch(inst_.data(), a.end, id);
  return Frag(a.begin, pl, a.nullable);
}